

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3Fts3SegReaderStep(Fts3Table *p,Fts3MultiSegReader *pCsr)

{
  uint uVar1;
  Fts3SegReader *pFVar2;
  Fts3HashElem **ppFVar3;
  sqlite3_uint64 sVar4;
  char *pcVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  char *pcVar9;
  int iVar10;
  ulong uVar11;
  Fts3SegReader **apSegment;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  size_t sVar15;
  sqlite3_uint64 sVar16;
  bool bVar17;
  int nList;
  _func_int_Fts3SegReader_ptr_Fts3SegReader_ptr *local_b0;
  ulong local_a8;
  sqlite3_uint64 local_a0;
  sqlite3_uint64 local_98;
  char *local_90;
  char *pList;
  char *local_80;
  long local_78;
  Fts3SegReader **local_70;
  ulong local_68;
  Fts3SegFilter *local_60;
  sqlite3_uint64 local_58;
  uint local_50;
  uint local_4c;
  Fts3Table *local_48;
  size_t local_40;
  sqlite_int64 local_38;
  
  uVar1 = pCsr->nSegment;
  local_78 = (long)(int)uVar1;
  local_b0 = fts3SegReaderDoclistCmpRev;
  if (p->bDescIdx == '\0') {
    local_b0 = fts3SegReaderDoclistCmp;
  }
  if (local_78 == 0) {
    return 0;
  }
  apSegment = pCsr->apSegment;
  local_60 = pCsr->pFilter;
  local_50 = 1;
  if (1 < (int)uVar1) {
    local_50 = uVar1;
  }
  uVar1 = local_60->flags;
  lVar13 = 0;
  local_4c = (uVar1 & 0x10) >> 4;
  local_70 = apSegment;
  local_48 = p;
  do {
    for (; iVar7 = pCsr->nAdvance, lVar13 < iVar7; lVar13 = lVar13 + 1) {
      pFVar2 = apSegment[lVar13];
      if (pFVar2->bLookup == '\0') {
        iVar7 = fts3SegReaderNext(p,pFVar2,iVar7);
        if (iVar7 != 0) {
          return iVar7;
        }
      }
      else {
        fts3SegReaderSetEof(pFVar2);
      }
    }
    fts3SegReaderSort(apSegment,(int)local_78,iVar7,fts3SegReaderCmp);
    pCsr->nAdvance = 0;
    pFVar2 = *apSegment;
    if (pFVar2->aNode == (char *)0x0) {
      return 0;
    }
    iVar7 = pFVar2->nTerm;
    pCsr->nTerm = iVar7;
    pcVar9 = pFVar2->zTerm;
    pCsr->zTerm = pcVar9;
    uVar12 = 1;
    lVar13 = local_78;
    if (local_60->zTerm != (char *)0x0 && (char)local_4c == '\0') {
      iVar6 = local_60->nTerm;
      if (iVar7 < iVar6) {
        return 0;
      }
      if ((uVar1 & 8) == 0 && iVar6 < iVar7) {
        return 0;
      }
      iVar6 = bcmp(pcVar9,local_60->zTerm,(long)iVar6);
      lVar13 = local_78;
      if (iVar6 != 0) {
        return 0;
      }
    }
    for (; (long)uVar12 < lVar13; uVar12 = uVar12 + 1) {
      pFVar2 = apSegment[uVar12];
      if (((pFVar2->aNode == (char *)0x0) || (pFVar2->nTerm != iVar7)) ||
         (iVar6 = bcmp(pcVar9,pFVar2->zTerm,(long)iVar7), iVar6 != 0)) goto LAB_001b3668;
    }
    uVar12 = (ulong)local_50;
LAB_001b3668:
    p = local_48;
    if (((int)uVar12 == 1) && ((uVar1 & 0x22) == 0)) {
      pFVar2 = *apSegment;
      ppFVar3 = pFVar2->ppNextElem;
      if (local_48->bDescIdx == '\0') {
        iVar7 = pFVar2->nDoclist;
        pCsr->nDoclist = iVar7;
        if (ppFVar3 == (Fts3HashElem **)0x0) goto LAB_001b3aec;
        iVar7 = fts3MsrBufferData(pCsr,pFVar2->aDoclist,iVar7);
        pCsr->aDoclist = pCsr->aBuffer;
        if (iVar7 != 0) goto LAB_001b3afc;
      }
      else {
        if (ppFVar3 != (Fts3HashElem **)0x0) goto LAB_001b36a3;
        pCsr->nDoclist = pFVar2->nDoclist;
LAB_001b3aec:
        pCsr->aDoclist = pFVar2->aDoclist;
      }
      iVar7 = 100;
LAB_001b3afc:
      pCsr->nAdvance = 1;
      return iVar7;
    }
LAB_001b36a3:
    uVar14 = uVar12 & 0xffffffff;
    local_a8 = uVar12;
    for (uVar11 = 0; uVar14 != uVar11; uVar11 = uVar11 + 1) {
      fts3SegReaderFirstDocid(p,apSegment[uVar11]);
    }
    fts3SegReaderSort(apSegment,(int)local_a8,(int)local_a8,local_b0);
    iVar7 = 0;
    local_a0 = 0;
    local_68 = uVar14;
    while (pFVar2 = *apSegment, pFVar2->pOffsetList != (char *)0x0) {
      pList = (char *)0x0;
      nList = 0;
      sVar4 = pFVar2->iDocid;
      fts3SegReaderNextDocid(p,pFVar2,&pList,&nList);
      for (uVar12 = 1; uVar14 != uVar12; uVar12 = uVar12 + 1) {
        pFVar2 = apSegment[uVar12];
        if ((pFVar2->pOffsetList == (char *)0x0) || (pFVar2->iDocid != sVar4)) goto LAB_001b3753;
        fts3SegReaderNextDocid(p,pFVar2,(char **)0x0,(int *)0x0);
      }
      uVar12 = uVar14 & 0xffffffff;
LAB_001b3753:
      if ((uVar1 & 4) != 0) {
        fts3ColumnFilter(local_60->iCol,0,&pList,&nList);
      }
      iVar6 = nList;
      sVar16 = local_a0;
      if (0 < nList || (uVar1 & 2) == 0) {
        local_98 = local_a0 - sVar4;
        if (iVar7 < 1) {
          local_98 = sVar4 - local_a0;
        }
        if (p->bDescIdx == '\0') {
          local_98 = sVar4 - local_a0;
        }
        if (((long)local_98 < 1) && (0 < iVar7 || local_98 != sVar4)) {
          return 0x10b;
        }
        sVar15 = (size_t)nList;
        local_90 = (char *)(ulong)(uint)nList;
        iVar8 = sqlite3Fts3VarintLen(local_98);
        iVar8 = (iVar6 + 1U & -(uVar1 & 1)) + iVar7 + iVar8;
        local_40 = sVar15;
        if (pCsr->nBuffer < iVar8) {
          iVar8 = iVar8 * 2;
          pCsr->nBuffer = iVar8;
          pcVar9 = (char *)sqlite3_realloc(pCsr->aBuffer,iVar8);
          if (pcVar9 == (char *)0x0) {
            return 7;
          }
          pCsr->aBuffer = pcVar9;
        }
        pcVar9 = pCsr->aBuffer + iVar7;
        local_58 = sVar4;
        if ((uVar1 & 0x20) == 0) {
          iVar6 = sqlite3Fts3PutVarint(pcVar9,local_98);
          iVar7 = iVar7 + iVar6;
          apSegment = local_70;
          uVar14 = local_68;
          sVar16 = local_58;
          if ((uVar1 & 1) != 0) {
            memcpy(pCsr->aBuffer + iVar7,pList,local_40);
            iVar6 = iVar7 + (int)local_90;
            iVar7 = (int)local_90 + iVar7 + 1;
            pCsr->aBuffer[iVar6] = '\0';
            apSegment = local_70;
            uVar14 = local_68;
            sVar16 = local_58;
          }
        }
        else {
          local_80 = pList;
          local_90 = pList;
          bVar17 = false;
          if (*pList == '\x01') {
            iVar6 = 0;
          }
          else {
            iVar6 = 0;
            bVar17 = *pList == '\x02';
            if (bVar17) {
              iVar8 = sqlite3Fts3PutVarint(pcVar9,local_98);
              iVar6 = iVar8 + 1;
              pcVar9[iVar8] = '\x02';
            }
            fts3ColumnlistCopy((char **)0x0,&local_80);
          }
          local_90 = local_90 + local_40;
          while (pcVar5 = local_80, local_80 < local_90) {
            iVar8 = sqlite3Fts3GetVarint(local_80 + 1,&local_38);
            local_80 = pcVar5 + (long)iVar8 + 1;
            if (*local_80 == '\x02') {
              if (!bVar17) {
                iVar8 = sqlite3Fts3PutVarint(pcVar9 + iVar6,local_98);
                iVar6 = iVar6 + iVar8;
              }
              pcVar9[iVar6] = '\x01';
              iVar8 = sqlite3Fts3PutVarint(pcVar9 + iVar6 + 1,local_38);
              iVar10 = iVar6 + iVar8;
              iVar6 = iVar6 + 2 + iVar8;
              pcVar9[iVar10 + 1] = '\x02';
              bVar17 = true;
            }
            fts3ColumnlistCopy((char **)0x0,&local_80);
          }
          iVar8 = iVar6;
          if (bVar17) {
            iVar8 = iVar6 + 1;
            pcVar9[iVar6] = '\0';
          }
          iVar7 = iVar7 + iVar8;
          apSegment = local_70;
          p = local_48;
          uVar14 = local_68;
          sVar16 = local_58;
          if (iVar8 == 0) {
            sVar16 = local_a0;
          }
        }
      }
      fts3SegReaderSort(apSegment,(int)local_a8,(int)uVar12,local_b0);
      local_a0 = sVar16;
    }
    if (0 < iVar7) {
      pCsr->aDoclist = pCsr->aBuffer;
      pCsr->nDoclist = iVar7;
      pCsr->nAdvance = (int)local_a8;
      return 100;
    }
    pCsr->nAdvance = (int)local_a8;
    lVar13 = 0;
  } while( true );
}

Assistant:

SQLITE_PRIVATE int sqlite3Fts3SegReaderStep(
  Fts3Table *p,                   /* Virtual table handle */
  Fts3MultiSegReader *pCsr        /* Cursor object */
){
  int rc = SQLITE_OK;

  int isIgnoreEmpty =  (pCsr->pFilter->flags & FTS3_SEGMENT_IGNORE_EMPTY);
  int isRequirePos =   (pCsr->pFilter->flags & FTS3_SEGMENT_REQUIRE_POS);
  int isColFilter =    (pCsr->pFilter->flags & FTS3_SEGMENT_COLUMN_FILTER);
  int isPrefix =       (pCsr->pFilter->flags & FTS3_SEGMENT_PREFIX);
  int isScan =         (pCsr->pFilter->flags & FTS3_SEGMENT_SCAN);
  int isFirst =        (pCsr->pFilter->flags & FTS3_SEGMENT_FIRST);

  Fts3SegReader **apSegment = pCsr->apSegment;
  int nSegment = pCsr->nSegment;
  Fts3SegFilter *pFilter = pCsr->pFilter;
  int (*xCmp)(Fts3SegReader *, Fts3SegReader *) = (
    p->bDescIdx ? fts3SegReaderDoclistCmpRev : fts3SegReaderDoclistCmp
  );

  if( pCsr->nSegment==0 ) return SQLITE_OK;

  do {
    int nMerge;
    int i;
  
    /* Advance the first pCsr->nAdvance entries in the apSegment[] array
    ** forward. Then sort the list in order of current term again.  
    */
    for(i=0; i<pCsr->nAdvance; i++){
      Fts3SegReader *pSeg = apSegment[i];
      if( pSeg->bLookup ){
        fts3SegReaderSetEof(pSeg);
      }else{
        rc = fts3SegReaderNext(p, pSeg, 0);
      }
      if( rc!=SQLITE_OK ) return rc;
    }
    fts3SegReaderSort(apSegment, nSegment, pCsr->nAdvance, fts3SegReaderCmp);
    pCsr->nAdvance = 0;

    /* If all the seg-readers are at EOF, we're finished. return SQLITE_OK. */
    assert( rc==SQLITE_OK );
    if( apSegment[0]->aNode==0 ) break;

    pCsr->nTerm = apSegment[0]->nTerm;
    pCsr->zTerm = apSegment[0]->zTerm;

    /* If this is a prefix-search, and if the term that apSegment[0] points
    ** to does not share a suffix with pFilter->zTerm/nTerm, then all 
    ** required callbacks have been made. In this case exit early.
    **
    ** Similarly, if this is a search for an exact match, and the first term
    ** of segment apSegment[0] is not a match, exit early.
    */
    if( pFilter->zTerm && !isScan ){
      if( pCsr->nTerm<pFilter->nTerm 
       || (!isPrefix && pCsr->nTerm>pFilter->nTerm)
       || memcmp(pCsr->zTerm, pFilter->zTerm, pFilter->nTerm) 
      ){
        break;
      }
    }

    nMerge = 1;
    while( nMerge<nSegment 
        && apSegment[nMerge]->aNode
        && apSegment[nMerge]->nTerm==pCsr->nTerm 
        && 0==memcmp(pCsr->zTerm, apSegment[nMerge]->zTerm, pCsr->nTerm)
    ){
      nMerge++;
    }

    assert( isIgnoreEmpty || (isRequirePos && !isColFilter) );
    if( nMerge==1 
     && !isIgnoreEmpty 
     && !isFirst 
     && (p->bDescIdx==0 || fts3SegReaderIsPending(apSegment[0])==0)
    ){
      pCsr->nDoclist = apSegment[0]->nDoclist;
      if( fts3SegReaderIsPending(apSegment[0]) ){
        rc = fts3MsrBufferData(pCsr, apSegment[0]->aDoclist, pCsr->nDoclist);
        pCsr->aDoclist = pCsr->aBuffer;
      }else{
        pCsr->aDoclist = apSegment[0]->aDoclist;
      }
      if( rc==SQLITE_OK ) rc = SQLITE_ROW;
    }else{
      int nDoclist = 0;           /* Size of doclist */
      sqlite3_int64 iPrev = 0;    /* Previous docid stored in doclist */

      /* The current term of the first nMerge entries in the array
      ** of Fts3SegReader objects is the same. The doclists must be merged
      ** and a single term returned with the merged doclist.
      */
      for(i=0; i<nMerge; i++){
        fts3SegReaderFirstDocid(p, apSegment[i]);
      }
      fts3SegReaderSort(apSegment, nMerge, nMerge, xCmp);
      while( apSegment[0]->pOffsetList ){
        int j;                    /* Number of segments that share a docid */
        char *pList = 0;
        int nList = 0;
        int nByte;
        sqlite3_int64 iDocid = apSegment[0]->iDocid;
        fts3SegReaderNextDocid(p, apSegment[0], &pList, &nList);
        j = 1;
        while( j<nMerge
            && apSegment[j]->pOffsetList
            && apSegment[j]->iDocid==iDocid
        ){
          fts3SegReaderNextDocid(p, apSegment[j], 0, 0);
          j++;
        }

        if( isColFilter ){
          fts3ColumnFilter(pFilter->iCol, 0, &pList, &nList);
        }

        if( !isIgnoreEmpty || nList>0 ){

          /* Calculate the 'docid' delta value to write into the merged 
          ** doclist. */
          sqlite3_int64 iDelta;
          if( p->bDescIdx && nDoclist>0 ){
            iDelta = iPrev - iDocid;
          }else{
            iDelta = iDocid - iPrev;
          }
          if( iDelta<=0 && (nDoclist>0 || iDelta!=iDocid) ){
            return FTS_CORRUPT_VTAB;
          }
          assert( nDoclist>0 || iDelta==iDocid );

          nByte = sqlite3Fts3VarintLen(iDelta) + (isRequirePos?nList+1:0);
          if( nDoclist+nByte>pCsr->nBuffer ){
            char *aNew;
            pCsr->nBuffer = (nDoclist+nByte)*2;
            aNew = sqlite3_realloc(pCsr->aBuffer, pCsr->nBuffer);
            if( !aNew ){
              return SQLITE_NOMEM;
            }
            pCsr->aBuffer = aNew;
          }

          if( isFirst ){
            char *a = &pCsr->aBuffer[nDoclist];
            int nWrite;
           
            nWrite = sqlite3Fts3FirstFilter(iDelta, pList, nList, a);
            if( nWrite ){
              iPrev = iDocid;
              nDoclist += nWrite;
            }
          }else{
            nDoclist += sqlite3Fts3PutVarint(&pCsr->aBuffer[nDoclist], iDelta);
            iPrev = iDocid;
            if( isRequirePos ){
              memcpy(&pCsr->aBuffer[nDoclist], pList, nList);
              nDoclist += nList;
              pCsr->aBuffer[nDoclist++] = '\0';
            }
          }
        }

        fts3SegReaderSort(apSegment, nMerge, j, xCmp);
      }
      if( nDoclist>0 ){
        pCsr->aDoclist = pCsr->aBuffer;
        pCsr->nDoclist = nDoclist;
        rc = SQLITE_ROW;
      }
    }
    pCsr->nAdvance = nMerge;
  }while( rc==SQLITE_OK );

  return rc;
}